

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c13565::MemPoolAccept::Finalize(MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  setEntries *this_00;
  base_blob<256u> *this_01;
  element_type *peVar1;
  CTxMemPoolEntry *this_02;
  CTxMemPoolEntry *this_03;
  CTxMemPool *pool;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  CCoinsViewCache *coins_cache;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int32_t local_c8;
  int32_t local_c4;
  GenTxid local_c0;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (base_blob<256u> *)ws->m_hash;
  peVar1 = (ws->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar3 = args->m_bypass_limits;
  this_00 = &(this->m_subpackage).m_all_conflicts;
  for (p_Var4 = (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var4 !=
      &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    this_02 = *(CTxMemPoolEntry **)(p_Var4 + 1);
    bVar2 = ::LogAcceptCategory(MEMPOOL,Debug);
    if (bVar2) {
      base_blob<256u>::ToString_abi_cxx11_
                ((string *)&local_c0,
                 (base_blob<256u> *)
                 &((this_02->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_58,
                 (base_blob<256u> *)
                 &((this_02->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_witness_hash);
      local_c4 = CTxMemPoolEntry::GetTxSize(this_02);
      base_blob<256u>::ToString_abi_cxx11_(&local_78,this_01);
      base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&peVar1->m_witness_hash);
      this_03 = (ws->m_entry)._M_t.
                super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
                super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
                super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl;
      local_c8 = CTxMemPoolEntry::GetTxSize(this_03);
      logging_function._M_str = "Finalize";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,long,int,std::__cxx11::string,std::__cxx11::string,long,int>
                (logging_function,source_file,0x51e,MEMPOOL,Debug,
                 (ConstevalFormatString<8U>)0x6c72b4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 &local_58,&this_02->nFee,&local_c4,&local_78,&local_98,&this_03->nFee,&local_c8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_c0,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this_02);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&(this->m_subpackage).m_replaced_transactions,(value_type *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (local_c0.m_hash.super_base_blob<256U>.m_data._M_elems + 7));
  }
  CTxMemPool::RemoveStaged(this->m_pool,this_00,false,REPLACED);
  std::_Rb_tree<$270907ca$>::clear(&this_00->_M_t);
  CTxMemPool::addUnchecked
            (this->m_pool,
             (ws->m_entry)._M_t.
             super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
             super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,&ws->m_ancestors);
  bVar2 = true;
  if ((args->m_package_submission == false) && (bVar3 == false)) {
    pool = this->m_pool;
    coins_cache = Chainstate::CoinsTip(this->m_active_chainstate);
    LimitMempoolSize(pool,coins_cache);
    local_c0.m_is_wtxid = false;
    local_c0.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)this_01;
    local_c0.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(this_01 + 8);
    local_c0.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)(this_01 + 0x10);
    local_c0.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(this_01 + 0x18);
    bVar3 = CTxMemPool::exists(this->m_pool,&local_c0);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"mempool full",(allocator<char> *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"",(allocator<char> *)&local_98);
      bVar2 = ValidationState<TxValidationResult>::Invalid
                        (&(ws->m_state).super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,
                         (string *)&local_c0,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MemPoolAccept::Finalize(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    const uint256& hash = ws.m_hash;
    TxValidationState& state = ws.m_state;
    const bool bypass_limits = args.m_bypass_limits;
    std::unique_ptr<CTxMemPoolEntry>& entry = ws.m_entry;

    if (!m_subpackage.m_all_conflicts.empty()) Assume(args.m_allow_replacement);
    // Remove conflicting transactions from the mempool
    for (CTxMemPool::txiter it : m_subpackage.m_all_conflicts)
    {
        LogDebug(BCLog::MEMPOOL, "replacing mempool tx %s (wtxid=%s, fees=%s, vsize=%s). New tx %s (wtxid=%s, fees=%s, vsize=%s)\n",
                it->GetTx().GetHash().ToString(),
                it->GetTx().GetWitnessHash().ToString(),
                it->GetFee(),
                it->GetTxSize(),
                hash.ToString(),
                tx.GetWitnessHash().ToString(),
                entry->GetFee(),
                entry->GetTxSize());
        TRACE7(mempool, replaced,
                it->GetTx().GetHash().data(),
                it->GetTxSize(),
                it->GetFee(),
                std::chrono::duration_cast<std::chrono::duration<std::uint64_t>>(it->GetTime()).count(),
                hash.data(),
                entry->GetTxSize(),
                entry->GetFee()
        );
        m_subpackage.m_replaced_transactions.push_back(it->GetSharedTx());
    }
    m_pool.RemoveStaged(m_subpackage.m_all_conflicts, false, MemPoolRemovalReason::REPLACED);
    // Don't attempt to process the same conflicts repeatedly during subpackage evaluation:
    // they no longer exist on subsequent calls to Finalize() post-RemoveStaged
    m_subpackage.m_all_conflicts.clear();
    // Store transaction in memory
    m_pool.addUnchecked(*entry, ws.m_ancestors);

    // trim mempool and check if tx was trimmed
    // If we are validating a package, don't trim here because we could evict a previous transaction
    // in the package. LimitMempoolSize() should be called at the very end to make sure the mempool
    // is still within limits and package submission happens atomically.
    if (!args.m_package_submission && !bypass_limits) {
        LimitMempoolSize(m_pool, m_active_chainstate.CoinsTip());
        if (!m_pool.exists(GenTxid::Txid(hash)))
            // The tx no longer meets our (new) mempool minimum feerate but could be reconsidered in a package.
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "mempool full");
    }
    return true;
}